

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

Attribute * Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<float>_>::makeNewAttribute(void)

{
  Attribute *this;
  
  this = (Attribute *)operator_new(0x30);
  this->_vptr_Attribute = (_func_int **)0x0;
  this[1]._vptr_Attribute = (_func_int **)0x0;
  this[2]._vptr_Attribute = (_func_int **)0x0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  this[5]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this);
  this->_vptr_Attribute = (_func_int **)&PTR__Attribute_0049bd40;
  *(undefined8 *)((long)&this[1]._vptr_Attribute + 4) = 0;
  *(undefined8 *)((long)&this[2]._vptr_Attribute + 4) = 0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  *(undefined4 *)&this[1]._vptr_Attribute = 0x3f800000;
  *(undefined4 *)&this[3]._vptr_Attribute = 0x3f800000;
  *(undefined4 *)&this[5]._vptr_Attribute = 0x3f800000;
  return this;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}